

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::socks5_alert::message_abi_cxx11_(string *__return_storage_ptr__,socks5_alert *this)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  allocator<char> local_265 [13];
  string local_258;
  string local_238;
  char local_218 [8];
  char buf [512];
  socks5_alert *this_local;
  
  buf._504_8_ = this;
  pcVar1 = operation_name(this->op);
  boost::system::error_code::message_abi_cxx11_(&local_238,&this->error);
  auVar3 = std::__cxx11::string::c_str();
  print_endpoint_abi_cxx11_(&local_258,(libtorrent *)&this->ip,auVar3._8_8_);
  uVar2 = std::__cxx11::string::c_str();
  snprintf(local_218,0x200,"SOCKS5 error. op: %s ec: %s ep: %s",pcVar1,auVar3._0_8_,uVar2);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_218,local_265);
  std::allocator<char>::~allocator(local_265);
  return __return_storage_ptr__;
}

Assistant:

std::string socks5_alert::message() const
	{
		char buf[512];
		std::snprintf(buf, sizeof(buf), "SOCKS5 error. op: %s ec: %s ep: %s"
			, operation_name(op), error.message().c_str(), print_endpoint(ip).c_str());
		return buf;
	}